

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int parse_number(frozen *f)

{
  int iVar1;
  bool bVar2;
  int _n;
  int ch;
  frozen *f_local;
  
  iVar1 = cur(f);
  f_local._4_4_ = capture_ptr(f,f->cur,JSON_TYPE_NUMBER);
  if (-1 < f_local._4_4_) {
    if (iVar1 == 0x2d) {
      f->cur = f->cur + 1;
    }
    if (f->cur < f->end) {
      iVar1 = is_digit((int)*f->cur);
      if (iVar1 == 0) {
        f_local._4_4_ = -1;
      }
      else {
        while( true ) {
          bVar2 = false;
          if (f->cur < f->end) {
            iVar1 = is_digit((int)*f->cur);
            bVar2 = iVar1 != 0;
          }
          if (!bVar2) break;
          f->cur = f->cur + 1;
        }
        if ((f->cur < f->end) && (*f->cur == '.')) {
          f->cur = f->cur + 1;
          if (f->end <= f->cur) {
            return -2;
          }
          iVar1 = is_digit((int)*f->cur);
          if (iVar1 == 0) {
            return -1;
          }
          while( true ) {
            bVar2 = false;
            if (f->cur < f->end) {
              iVar1 = is_digit((int)*f->cur);
              bVar2 = iVar1 != 0;
            }
            if (!bVar2) break;
            f->cur = f->cur + 1;
          }
        }
        if ((f->cur < f->end) && ((*f->cur == 'e' || (*f->cur == 'E')))) {
          f->cur = f->cur + 1;
          if (f->end <= f->cur) {
            return -2;
          }
          if ((*f->cur == '+') || (*f->cur == '-')) {
            f->cur = f->cur + 1;
          }
          if (f->end <= f->cur) {
            return -2;
          }
          iVar1 = is_digit((int)*f->cur);
          if (iVar1 == 0) {
            return -1;
          }
          while( true ) {
            bVar2 = false;
            if (f->cur < f->end) {
              iVar1 = is_digit((int)*f->cur);
              bVar2 = iVar1 != 0;
            }
            if (!bVar2) break;
            f->cur = f->cur + 1;
          }
        }
        capture_len(f,f->num_tokens + -1,f->cur);
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = -2;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int parse_number(struct frozen *f) {
    int ch = cur(f);
    TRY(capture_ptr(f, f->cur, JSON_TYPE_NUMBER));
    if (ch == '-') f->cur++;
    EXPECT(f->cur < f->end, JSON_STRING_INCOMPLETE);
    EXPECT(is_digit(f->cur[0]), JSON_STRING_INVALID);
    while (f->cur < f->end && is_digit(f->cur[0])) f->cur++;
    if (f->cur < f->end && f->cur[0] == '.') {
        f->cur++;
        EXPECT(f->cur < f->end, JSON_STRING_INCOMPLETE);
        EXPECT(is_digit(f->cur[0]), JSON_STRING_INVALID);
        while (f->cur < f->end && is_digit(f->cur[0])) f->cur++;
    }
    if (f->cur < f->end && (f->cur[0] == 'e' || f->cur[0] == 'E')) {
        f->cur++;
        EXPECT(f->cur < f->end, JSON_STRING_INCOMPLETE);
        if ((f->cur[0] == '+' || f->cur[0] == '-')) f->cur++;
        EXPECT(f->cur < f->end, JSON_STRING_INCOMPLETE);
        EXPECT(is_digit(f->cur[0]), JSON_STRING_INVALID);
        while (f->cur < f->end && is_digit(f->cur[0])) f->cur++;
    }
    capture_len(f, f->num_tokens - 1, f->cur);
    return 0;
}